

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void WebRtc_rdft(size_t n,int isgn,float *a,size_t *ip,float *w)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  sVar4 = *ip;
  if (sVar4 * 4 < n) {
    sVar4 = n >> 2;
    *ip = sVar4;
    ip[1] = 1;
    if (0xb < n) {
      uVar2 = n >> 3;
      fVar11 = 0.7853982 / (float)uVar2;
      w[0] = 1.0;
      w[1] = 0.0;
      dVar9 = cos((double)((float)uVar2 * fVar11));
      w[uVar2] = (float)dVar9;
      w[uVar2 + 1] = (float)dVar9;
      if (0x17 < n) {
        pfVar7 = w + (sVar4 - 1);
        uVar5 = 2;
        do {
          dVar9 = (double)((float)(long)uVar5 * fVar11);
          dVar10 = cos(dVar9);
          dVar9 = sin(dVar9);
          w[uVar5] = (float)dVar10;
          w[uVar5 + 1] = (float)dVar9;
          pfVar7[-1] = (float)dVar9;
          *pfVar7 = (float)dVar10;
          uVar5 = uVar5 + 2;
          pfVar7 = pfVar7 + -2;
        } while (uVar5 < uVar2);
        bitrv2(sVar4,ip + 2,w);
      }
    }
  }
  sVar3 = ip[1];
  if (sVar3 * 4 < n) {
    sVar3 = n >> 2;
    ip[1] = sVar3;
    if (7 < n) {
      pfVar7 = w + sVar4;
      uVar2 = n >> 3;
      fVar11 = 0.7853982 / (float)uVar2;
      dVar9 = cos((double)((float)uVar2 * fVar11));
      *pfVar7 = (float)dVar9;
      pfVar7[uVar2] = (float)dVar9 * 0.5;
      if (0xf < n) {
        pfVar8 = w + sVar4 + sVar3;
        uVar5 = 1;
        do {
          pfVar8 = pfVar8 + -1;
          dVar9 = (double)((float)(long)uVar5 * fVar11);
          dVar10 = cos(dVar9);
          pfVar7[uVar5] = (float)dVar10 * 0.5;
          dVar9 = sin(dVar9);
          *pfVar8 = (float)dVar9 * 0.5;
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
  }
  if (isgn < 0) {
    fVar11 = (*a - a[1]) * 0.5;
    a[1] = fVar11;
    *a = *a - fVar11;
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
        return;
      }
    }
    else {
      a[1] = -fVar11;
      uVar2 = n >> 1;
      if (n != 5) {
        lVar1 = n - 2;
        uVar5 = 2;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + (sVar3 * 2) / uVar2;
          fVar12 = (float)*(undefined8 *)(a + uVar5);
          fVar13 = (float)((ulong)*(undefined8 *)(a + uVar5) >> 0x20);
          fVar20 = fVar12 - (float)*(undefined8 *)(a + lVar1);
          fVar18 = (float)((ulong)*(undefined8 *)(a + lVar1) >> 0x20) + fVar13;
          fVar11 = (0.5 - w[sVar4 + (sVar3 - lVar6)]) * fVar20 + fVar18 * w[sVar4 + lVar6];
          fVar18 = (0.5 - w[sVar4 + (sVar3 - lVar6)]) * fVar18 + fVar20 * -w[sVar4 + lVar6];
          *(ulong *)(a + uVar5) = CONCAT44(fVar18 - fVar13,fVar12 - fVar11);
          *(ulong *)(a + lVar1) =
               CONCAT44(fVar18 - (float)((ulong)*(undefined8 *)(a + lVar1) >> 0x20),
                        fVar11 + (float)*(undefined8 *)(a + lVar1));
          uVar5 = uVar5 + 2;
          lVar1 = lVar1 + -2;
        } while (uVar5 < uVar2);
      }
      a[uVar2 + 1] = -a[uVar2 + 1];
      bitrv2(n,ip + 2,a);
      uVar2 = 2;
      if (8 < n) {
        cft1st(n,a,w);
        uVar2 = 8;
        if (0x20 < n) {
          uVar5 = 0x20;
          sVar4 = 8;
          do {
            uVar2 = uVar5;
            cftmdl(n,sVar4,a,w);
            uVar5 = uVar2 * 4;
            sVar4 = uVar2;
          } while (uVar2 * 4 < n);
        }
      }
      if (uVar2 * 4 - n == 0) {
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            fVar13 = -a[uVar5 + 1] - a[uVar2 + uVar5 + 1];
            fVar12 = a[uVar5] + a[uVar2 + uVar5];
            fVar11 = a[uVar2 + uVar5 + 1] - a[uVar5 + 1];
            fVar18 = a[uVar5] - a[uVar2 + uVar5];
            fVar20 = (float)*(undefined8 *)(a + uVar2 * 2 + uVar5);
            fVar14 = (float)((ulong)*(undefined8 *)(a + uVar2 * 2 + uVar5) >> 0x20);
            fVar15 = (float)*(undefined8 *)(a + uVar2 * 3 + uVar5);
            fVar17 = fVar20 + fVar15;
            fVar16 = (float)((ulong)*(undefined8 *)(a + uVar2 * 3 + uVar5) >> 0x20);
            fVar19 = fVar14 + fVar16;
            fVar20 = fVar20 - fVar15;
            fVar14 = fVar14 - fVar16;
            a[uVar5] = fVar12 + fVar17;
            a[uVar5 + 1] = fVar13 - fVar19;
            a[uVar2 * 2 + uVar5] = fVar12 - fVar17;
            a[uVar2 * 2 + uVar5 + 1] = fVar19 + fVar13;
            *(ulong *)(a + uVar2 + uVar5) = CONCAT44(fVar11 - fVar20,fVar18 - fVar14);
            *(ulong *)(a + uVar2 * 3 + uVar5) = CONCAT44(fVar20 + fVar11,fVar14 + fVar18);
            uVar5 = uVar5 + 2;
          } while (uVar5 < uVar2);
        }
      }
      else if (uVar2 != 0) {
        uVar5 = 0;
        do {
          fVar11 = a[uVar5];
          fVar18 = a[uVar2 + uVar5];
          fVar12 = a[uVar2 + uVar5 + 1];
          a[uVar5] = fVar11 + fVar18;
          fVar13 = a[uVar5 + 1];
          a[uVar5 + 1] = -fVar13 - a[uVar2 + uVar5 + 1];
          *(ulong *)(a + uVar2 + uVar5) = CONCAT44(fVar12 - fVar13,fVar11 - fVar18);
          uVar5 = uVar5 + 2;
        } while (uVar5 < uVar2);
      }
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(n,ip + 2,a);
      cftfsub(n,a,w);
      if (n != 5) {
        lVar6 = n - 2;
        uVar2 = 2;
        lVar1 = 0;
        do {
          lVar1 = lVar1 + (sVar3 * 2) / (n >> 1);
          fVar12 = (float)*(undefined8 *)(a + uVar2);
          fVar13 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
          fVar20 = fVar12 - (float)*(undefined8 *)(a + lVar6);
          fVar18 = (float)((ulong)*(undefined8 *)(a + lVar6) >> 0x20) + fVar13;
          fVar11 = (0.5 - w[sVar4 + (sVar3 - lVar1)]) * fVar20 + -w[sVar4 + lVar1] * fVar18;
          fVar18 = (0.5 - w[sVar4 + (sVar3 - lVar1)]) * fVar18 + w[sVar4 + lVar1] * fVar20;
          *(ulong *)(a + uVar2) = CONCAT44(fVar13 - fVar18,fVar12 - fVar11);
          *(ulong *)(a + lVar6) =
               CONCAT44((float)((ulong)*(undefined8 *)(a + lVar6) >> 0x20) - fVar18,
                        (float)*(undefined8 *)(a + lVar6) + fVar11);
          uVar2 = uVar2 + 2;
          lVar6 = lVar6 + -2;
        } while (uVar2 < n >> 1);
      }
    }
    fVar11 = *a;
    *a = fVar11 + a[1];
    a[1] = fVar11 - a[1];
  }
  return;
}

Assistant:

void WebRtc_rdft(size_t n, int isgn, float *a, size_t *ip, float *w)
{
    size_t nw, nc;
    float xi;

    nw = ip[0];
    if (n > (nw << 2)) {
        nw = n >> 2;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 2)) {
        nc = n >> 2;
        makect(nc, ip, w + nw);
    }
    if (isgn >= 0) {
        if (n > 4) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
            rftfsub(n, a, nc, w + nw);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
        xi = a[0] - a[1];
        a[0] += a[1];
        a[1] = xi;
    } else {
        a[1] = 0.5f * (a[0] - a[1]);
        a[0] -= a[1];
        if (n > 4) {
            rftbsub(n, a, nc, w + nw);
            bitrv2(n, ip + 2, a);
            cftbsub(n, a, w);
        } else if (n == 4) {
            cftfsub(n, a, w);
        }
    }
}